

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIso2.c
# Opt level: O3

Gia_Man_t *
Gia_ManIsoReduce2(Gia_Man_t *pGia,Vec_Ptr_t **pvPosEquivs,Vec_Ptr_t **pvPiPerms,int fEstimate,
                 int fBetterQual,int fDualOut,int fVerbose,int fVeryVerbose)

{
  uint uVar1;
  int iVar2;
  Vec_Wec_t *vEquivs;
  Vec_Wec_t *__ptr;
  Gia_Man_t *pGVar3;
  Vec_Int_t *pVVar4;
  int *piVar5;
  Vec_Ptr_t *pVVar6;
  void **ppvVar7;
  void *pvVar8;
  long lVar9;
  size_t __size;
  long lVar10;
  size_t __size_00;
  int iVar11;
  uint uVar12;
  long lVar13;
  ulong uVar14;
  ulong uVar15;
  int nPos;
  uint uVar16;
  Vec_Ptr_t **ppVVar17;
  timespec local_60;
  Vec_Wec_t *local_50;
  Vec_Ptr_t **local_48;
  Gia_Man_t *local_40;
  Vec_Ptr_t **local_38;
  
  iVar2 = clock_gettime(3,&local_60);
  if (iVar2 < 0) {
    lVar10 = -1;
  }
  else {
    lVar10 = local_60.tv_nsec / 1000 + local_60.tv_sec * 1000000;
  }
  local_38 = pvPiPerms;
  vEquivs = Gia_Iso2ManPerform(pGia,fVeryVerbose);
  lVar9 = (long)vEquivs->nSize;
  if (lVar9 < 1) {
    uVar15 = 0;
    uVar14 = 0;
  }
  else {
    lVar13 = 0;
    uVar15 = 0;
    uVar16 = 0;
    uVar14 = 0;
    do {
      iVar2 = *(int *)((long)&vEquivs->pArray->nSize + lVar13);
      if (1 < iVar2) {
        uVar15 = (ulong)(iVar2 + uVar16);
        uVar16 = iVar2 + uVar16;
      }
      uVar14 = (ulong)((int)uVar14 + (uint)(1 < iVar2));
      lVar13 = lVar13 + 0x10;
    } while (lVar9 << 4 != lVar13);
  }
  printf("Reduced %d outputs to %d candidate   classes (%d outputs are in %d non-trivial classes).  "
         ,(ulong)(uint)(pGia->vCos->nSize - pGia->nRegs),lVar9,uVar15,uVar14);
  iVar11 = 3;
  iVar2 = clock_gettime(3,&local_60);
  if (iVar2 < 0) {
    lVar9 = -1;
  }
  else {
    lVar9 = local_60.tv_nsec / 1000 + local_60.tv_sec * 1000000;
  }
  Abc_Print(iVar11,"%s =","Time");
  Abc_Print(iVar11,"%9.2f sec\n",(double)(lVar9 - lVar10) / 1000000.0);
  if (fEstimate != 0) {
    iVar2 = vEquivs->nCap;
    pVVar4 = vEquivs->pArray;
    if ((long)iVar2 < 1) {
      if (pVVar4 == (Vec_Int_t *)0x0) goto LAB_007580d8;
    }
    else {
      lVar10 = 0;
      do {
        pvVar8 = *(void **)((long)&pVVar4->pArray + lVar10);
        if (pvVar8 != (void *)0x0) {
          free(pvVar8);
          *(undefined8 *)((long)&pVVar4->pArray + lVar10) = 0;
        }
        lVar10 = lVar10 + 0x10;
      } while ((long)iVar2 * 0x10 != lVar10);
    }
    free(pVVar4);
LAB_007580d8:
    free(vEquivs);
    pGVar3 = Gia_ManDup(pGia);
    return pGVar3;
  }
  if (fBetterQual == 0) {
    __ptr = Gia_Iso2ManCheckIsoClassesSkip(pGia,vEquivs);
  }
  else {
    __ptr = Gia_Iso2ManCheckIsoClasses(pGia,vEquivs);
  }
  iVar2 = vEquivs->nCap;
  pVVar4 = vEquivs->pArray;
  local_48 = pvPosEquivs;
  if ((long)iVar2 < 1) {
    if (pVVar4 != (Vec_Int_t *)0x0) goto LAB_0075813f;
  }
  else {
    lVar9 = 0;
    do {
      pvVar8 = *(void **)((long)&pVVar4->pArray + lVar9);
      if (pvVar8 != (void *)0x0) {
        free(pvVar8);
        *(undefined8 *)((long)&pVVar4->pArray + lVar9) = 0;
      }
      lVar9 = lVar9 + 0x10;
    } while ((long)iVar2 * 0x10 != lVar9);
LAB_0075813f:
    free(pVVar4);
  }
  free(vEquivs);
  qsort(__ptr->pArray,(long)__ptr->nSize,0x10,Vec_WecSortCompare3);
  iVar2 = __ptr->nSize;
  pVVar4 = (Vec_Int_t *)malloc(0x10);
  iVar11 = 0x10;
  if (0xe < iVar2 - 1U) {
    iVar11 = iVar2;
  }
  pVVar4->nSize = 0;
  pVVar4->nCap = iVar11;
  nPos = 0;
  if (iVar11 == 0) {
    piVar5 = (int *)0x0;
  }
  else {
    piVar5 = (int *)malloc((long)iVar11 << 2);
  }
  pVVar4->pArray = piVar5;
  if (0 < iVar2) {
    lVar9 = 8;
    lVar13 = 0;
    do {
      if (0 < *(int *)((long)__ptr->pArray + lVar9 + -4)) {
        Vec_IntPush(pVVar4,**(int **)((long)&__ptr->pArray->nCap + lVar9));
        iVar2 = __ptr->nSize;
      }
      lVar13 = lVar13 + 1;
      lVar9 = lVar9 + 0x10;
    } while (lVar13 < iVar2);
    piVar5 = pVVar4->pArray;
    nPos = pVVar4->nSize;
  }
  uVar16 = 0;
  local_40 = Gia_ManDupCones(pGia,piVar5,nPos,0);
  if (piVar5 != (int *)0x0) {
    free(piVar5);
  }
  free(pVVar4);
  lVar9 = (long)__ptr->nSize;
  uVar15 = 0;
  if (0 < lVar9) {
    lVar13 = 0;
    uVar16 = 0;
    uVar12 = 0;
    uVar15 = 0;
    do {
      iVar2 = *(int *)((long)&__ptr->pArray->nSize + lVar13);
      uVar1 = iVar2 + uVar12;
      if (1 < iVar2) {
        uVar12 = uVar1;
        uVar16 = uVar1;
      }
      uVar15 = (ulong)((int)uVar15 + (uint)(1 < iVar2));
      lVar13 = lVar13 + 0x10;
    } while (lVar9 << 4 != lVar13);
  }
  printf("Reduced %d outputs to %d equivalence classes (%d outputs are in %d non-trivial classes).  "
         ,(ulong)(uint)(pGia->vCos->nSize - pGia->nRegs),lVar9,(ulong)uVar16,uVar15);
  iVar11 = 3;
  iVar2 = clock_gettime(3,&local_60);
  if (iVar2 < 0) {
    lVar9 = -1;
  }
  else {
    lVar9 = local_60.tv_nsec / 1000 + local_60.tv_sec * 1000000;
  }
  Abc_Print(iVar11,"%s =","Time");
  Abc_Print(iVar11,"%9.2f sec\n",(double)(lVar9 - lVar10) / 1000000.0);
  if (fVerbose != 0) {
    puts("Nontrivial classes:");
    iVar2 = __ptr->nSize;
    if (0 < iVar2) {
      uVar15 = 0;
      do {
        pVVar4 = __ptr->pArray;
        if (pVVar4[uVar15].nSize != 1) {
          printf(" %4d : {",uVar15 & 0xffffffff);
          if (0 < pVVar4[uVar15].nSize) {
            lVar10 = 0;
            do {
              printf(" %d",(ulong)(uint)pVVar4[uVar15].pArray[lVar10]);
              lVar10 = lVar10 + 1;
            } while (lVar10 < pVVar4[uVar15].nSize);
          }
          puts(" }");
          iVar2 = __ptr->nSize;
        }
        uVar15 = uVar15 + 1;
      } while ((long)uVar15 < (long)iVar2);
    }
  }
  ppVVar17 = local_48;
  if (local_38 != (Vec_Ptr_t **)0x0) {
    *local_38 = (Vec_Ptr_t *)0x0;
  }
  if (local_48 != (Vec_Ptr_t **)0x0) {
    iVar2 = __ptr->nSize;
    pVVar6 = (Vec_Ptr_t *)malloc(0x10);
    iVar11 = 8;
    if (6 < iVar2 - 1U) {
      iVar11 = iVar2;
    }
    pVVar6->nSize = 0;
    pVVar6->nCap = iVar11;
    if (iVar11 == 0) {
      ppvVar7 = (void **)0x0;
    }
    else {
      ppvVar7 = (void **)malloc((long)iVar11 << 3);
    }
    pVVar6->pArray = ppvVar7;
    if (0 < iVar2) {
      __size = 0;
      uVar15 = 0;
      local_50 = __ptr;
      do {
        pVVar4 = __ptr->pArray;
        piVar5 = (int *)malloc(0x10);
        iVar2 = *(int *)((long)&pVVar4->nSize + __size);
        piVar5[1] = iVar2;
        *piVar5 = iVar2;
        if ((long)iVar2 == 0) {
          __size_00 = 0;
          pvVar8 = (void *)0x0;
        }
        else {
          __size_00 = (long)iVar2 << 2;
          pvVar8 = malloc(__size_00);
        }
        *(void **)(piVar5 + 2) = pvVar8;
        memcpy(pvVar8,*(void **)((long)&pVVar4->pArray + __size),__size_00);
        __ptr = local_50;
        if ((int)uVar15 == iVar11) {
          ppvVar7 = pVVar6->pArray;
          if (uVar15 < 0x10) {
            if (ppvVar7 == (void **)0x0) {
              ppvVar7 = (void **)malloc(0x80);
            }
            else {
              ppvVar7 = (void **)realloc(ppvVar7,0x80);
            }
            pVVar6->pArray = ppvVar7;
            iVar11 = 0x10;
          }
          else {
            if (ppvVar7 == (void **)0x0) {
              ppvVar7 = (void **)malloc(__size);
            }
            else {
              ppvVar7 = (void **)realloc(ppvVar7,__size);
            }
            pVVar6->pArray = ppvVar7;
            iVar11 = iVar11 * 2;
          }
        }
        else {
          ppvVar7 = pVVar6->pArray;
        }
        ppvVar7[uVar15] = piVar5;
        uVar15 = uVar15 + 1;
        __size = __size + 0x10;
      } while ((long)uVar15 < (long)__ptr->nSize);
      pVVar6->nSize = (int)uVar15;
      pVVar6->nCap = iVar11;
      ppVVar17 = local_48;
    }
    *ppVVar17 = pVVar6;
  }
  iVar2 = __ptr->nCap;
  pVVar4 = __ptr->pArray;
  if ((long)iVar2 < 1) {
    if (pVVar4 == (Vec_Int_t *)0x0) goto LAB_0075854d;
  }
  else {
    lVar10 = 0;
    do {
      pvVar8 = *(void **)((long)&pVVar4->pArray + lVar10);
      if (pvVar8 != (void *)0x0) {
        free(pvVar8);
        pVVar4 = __ptr->pArray;
        *(undefined8 *)((long)&pVVar4->pArray + lVar10) = 0;
      }
      lVar10 = lVar10 + 0x10;
    } while ((long)iVar2 * 0x10 != lVar10);
  }
  free(pVVar4);
LAB_0075854d:
  free(__ptr);
  return local_40;
}

Assistant:

Gia_Man_t * Gia_ManIsoReduce2( Gia_Man_t * pGia, Vec_Ptr_t ** pvPosEquivs, Vec_Ptr_t ** pvPiPerms, int fEstimate, int fBetterQual, int fDualOut, int fVerbose, int fVeryVerbose )
{
    Gia_Man_t * pPart;
    Vec_Wec_t * vEquivs, * vEquivs2;
    Vec_Int_t * vRemains;
    int nClasses, nUsedPos;
    abctime clk = Abc_Clock();
    vEquivs = Gia_Iso2ManPerform( pGia, fVeryVerbose );
    // report class stats
    nClasses = Vec_WecCountNonTrivial( vEquivs, &nUsedPos );
    printf( "Reduced %d outputs to %d candidate   classes (%d outputs are in %d non-trivial classes).  ", 
        Gia_ManPoNum(pGia), Vec_WecSize(vEquivs), nUsedPos, nClasses );
    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
    if ( fEstimate )
    {
        Vec_WecFree( vEquivs );
        return Gia_ManDup(pGia);
    }
    // verify classes
    if ( fBetterQual )
        vEquivs2 = Gia_Iso2ManCheckIsoClasses( pGia, vEquivs );
    else
        vEquivs2 = Gia_Iso2ManCheckIsoClassesSkip( pGia, vEquivs );
    Vec_WecFree( vEquivs );
    vEquivs = vEquivs2;
    // sort equiv classes by the first integer
    Vec_WecSortByFirstInt( vEquivs, 0 );
    // find the first outputs
    vRemains = Vec_WecCollectFirsts( vEquivs );
    // derive the final GIA
    pPart = Gia_ManDupCones( pGia, Vec_IntArray(vRemains), Vec_IntSize(vRemains), 0 );
    Vec_IntFree( vRemains );
    // report class stats
    nClasses = Vec_WecCountNonTrivial( vEquivs, &nUsedPos );
    printf( "Reduced %d outputs to %d equivalence classes (%d outputs are in %d non-trivial classes).  ", 
        Gia_ManPoNum(pGia), Vec_WecSize(vEquivs), nUsedPos, nClasses );
    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
    if ( fVerbose )
    { 
        printf( "Nontrivial classes:\n" );
        Vec_WecPrint( vEquivs, 1 );
    }
    if ( pvPiPerms )
        *pvPiPerms = NULL;
    if ( pvPosEquivs )
        *pvPosEquivs = Vec_WecConvertToVecPtr( vEquivs );
    Vec_WecFree( vEquivs );
//    Gia_ManStopP( &pPart );
    return pPart;
}